

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void upb_MtDecoder_ParseMessage(upb_MtDecoder *d,char *data,size_t len)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  upb_SubCounts uVar4;
  char *pcVar5;
  ulong uVar6;
  upb_MiniTableField *puVar7;
  upb_MiniTable *puVar8;
  upb_MiniTableField *puVar9;
  upb_MiniTableSubInternal *puVar10;
  char *pcVar11;
  upb_Arena *puVar12;
  uint16_t uVar13;
  ulong uVar14;
  ulong uVar15;
  upb_SubCounts sub_counts;
  upb_SubCounts local_34;
  
  puVar12 = d->arena;
  uVar15 = len * 0xc + 7 & 0xfffffffffffffff8;
  puVar9 = (upb_MiniTableField *)puVar12->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar12->end_dont_copy_me__upb_internal_use_only - (long)puVar9) < uVar15) {
    puVar9 = (upb_MiniTableField *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar12,uVar15);
  }
  else {
    if ((upb_MiniTableField *)((ulong)((long)&puVar9->presence + 1U) & 0xfffffffffffffff8) != puVar9
       ) goto LAB_001232f3;
    puVar12->ptr_dont_copy_me__upb_internal_use_only =
         (char *)((long)&puVar9->number_dont_copy_me__upb_internal_use_only + uVar15);
  }
  d->fields = puVar9;
  if (puVar9 != (upb_MiniTableField *)0x0) {
    local_34.submsg_count = 0;
    local_34.subenum_count = 0;
    puVar8 = d->table;
    puVar8->field_count_dont_copy_me__upb_internal_use_only = 0;
    puVar8->fields_dont_copy_me__upb_internal_use_only = puVar9;
    upb_MtDecoder_Parse(d,data,len,puVar9,0xc,
                        &puVar8->field_count_dont_copy_me__upb_internal_use_only,&local_34);
    uVar4 = local_34;
    puVar12 = d->arena;
    puVar9 = d->fields;
    if ((char *)((long)&puVar9->number_dont_copy_me__upb_internal_use_only + uVar15) !=
        puVar12->ptr_dont_copy_me__upb_internal_use_only) {
      __assert_fail("(char*)ptr + oldsize == a->ptr_dont_copy_me__upb_internal_use_only - 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/internal/arena.h"
                    ,0x68,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
    puVar8 = d->table;
    uVar1 = puVar8->field_count_dont_copy_me__upb_internal_use_only;
    uVar14 = (ulong)(((uint)uVar1 + (uint)uVar1 * 2) * 4 + 7 & 0xfffffff8);
    if (uVar15 < uVar14) {
      __assert_fail("size <= oldsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/internal/arena.h"
                    ,0x69,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
    puVar10 = (upb_MiniTableSubInternal *)
              ((long)&puVar9->number_dont_copy_me__upb_internal_use_only + uVar14);
    puVar12->ptr_dont_copy_me__upb_internal_use_only = (char *)puVar10;
    puVar8->fields_dont_copy_me__upb_internal_use_only = puVar9;
    uVar14 = (ulong)(uint)local_34;
    uVar3 = (uint)local_34 >> 0x10;
    uVar13 = local_34.submsg_count;
    iVar2 = (int)(uVar14 & 0xffff);
    uVar15 = (ulong)((uVar3 + iVar2) * 8);
    pcVar5 = puVar12->end_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)pcVar5 - (long)puVar10) < uVar15) {
      puVar10 = (upb_MiniTableSubInternal *)
                _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar12,uVar15);
      puVar12 = d->arena;
      pcVar11 = puVar12->ptr_dont_copy_me__upb_internal_use_only;
      pcVar5 = puVar12->end_dont_copy_me__upb_internal_use_only;
    }
    else {
      if ((upb_MiniTableSubInternal *)((ulong)((long)puVar10 + 7U) & 0xfffffffffffffff8) != puVar10)
      goto LAB_001232f3;
      pcVar11 = (char *)(uVar15 + (long)puVar10);
      puVar12->ptr_dont_copy_me__upb_internal_use_only = pcVar11;
    }
    uVar15 = (ulong)(((uint)uVar4 & 0xffff) << 3);
    if ((ulong)((long)pcVar5 - (long)pcVar11) < uVar15) {
      pcVar11 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar12,uVar15);
    }
    else {
      if ((char *)((ulong)(pcVar11 + 7) & 0xfffffffffffffff8) != pcVar11) {
LAB_001232f3:
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/internal/arena.h"
                      ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      puVar12->ptr_dont_copy_me__upb_internal_use_only = pcVar11 + uVar15;
    }
    if ((puVar10 != (upb_MiniTableSubInternal *)0x0) && (pcVar11 != (char *)0x0)) {
      if (iVar2 != 0) {
        uVar6 = 0;
        do {
          *(upb_MiniTable **)(pcVar11 + uVar6) =
               &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
          *(char **)((long)puVar10 + uVar6) = pcVar11 + uVar6;
          uVar6 = uVar6 + 8;
        } while (uVar15 != uVar6);
      }
      puVar8 = d->table;
      if (0xffff < (uint)uVar4) {
        if ((ulong)puVar8->field_count_dont_copy_me__upb_internal_use_only != 0) {
          puVar7 = d->fields;
          puVar9 = puVar7 + puVar8->field_count_dont_copy_me__upb_internal_use_only;
          do {
            if (puVar7->descriptortype_dont_copy_me__upb_internal_use_only == '\x0e') {
              puVar7->submsg_index_dont_copy_me__upb_internal_use_only =
                   puVar7->submsg_index_dont_copy_me__upb_internal_use_only + uVar13;
            }
            puVar7 = puVar7 + 1;
          } while (puVar7 < puVar9);
        }
        memset(puVar10 + (uVar14 & 0xffff),0,(ulong)(uVar3 - 1) * 8 + 8);
        puVar8 = d->table;
      }
      puVar8->subs_dont_copy_me__upb_internal_use_only = puVar10;
      return;
    }
  }
  upb_MdDecoder_ErrorJmp(&d->base,"Out of memory");
}

Assistant:

static void upb_MtDecoder_ParseMessage(upb_MtDecoder* d, const char* data,
                                       size_t len) {
  // Buffer length is an upper bound on the number of fields. We will return
  // what we don't use.
  d->fields = upb_Arena_Malloc(d->arena, sizeof(*d->fields) * len);
  upb_MdDecoder_CheckOutOfMemory(&d->base, d->fields);

  upb_SubCounts sub_counts = {0, 0};
  d->table->UPB_PRIVATE(field_count) = 0;
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_Parse(d, data, len, d->fields, sizeof(*d->fields),
                      &d->table->UPB_PRIVATE(field_count), &sub_counts);

  upb_Arena_ShrinkLast(d->arena, d->fields, sizeof(*d->fields) * len,
                       sizeof(*d->fields) * d->table->UPB_PRIVATE(field_count));
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_AllocateSubs(d, sub_counts);
}